

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
google::protobuf::FatalException::FatalException
          (FatalException *this,char *filename,int line,string *message)

{
  *(undefined ***)this = &PTR__FatalException_00297778;
  this->filename_ = filename;
  this->line_ = line;
  std::__cxx11::string::string((string *)&this->message_,(string *)message);
  return;
}

Assistant:

FatalException(const char* filename, int line, const std::string& message)
      : filename_(filename), line_(line), message_(message) {}